

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_hex_test.cxx
# Opt level: O0

void __thiscall pangram_to_hex_test::test_method(pangram_to_hex_test *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e8;
  basic_cstring<const_char> local_c0;
  basic_cstring<const_char> local_b0;
  char *local_a0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  cryptox local_90 [8];
  string output;
  allocator local_69;
  string local_68 [8];
  string expected;
  allocator local_31;
  string local_30 [8];
  string input;
  pangram_to_hex_test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"The quick brown fox jumps over the lazy dog",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "54686520717569636b2062726f776e20666f78206a756d7073206f76657220746865206c617a7920646f67"
             ,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_98._M_current = (char *)std::__cxx11::string::begin();
  local_a0 = (char *)std::__cxx11::string::end();
  cryptox::to_hex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (local_90,local_98,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_a0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/to_hex_test.cxx"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b0,0x1e,&local_c0);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e8,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/to_hex_test.cxx"
               ,0x6c);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_e8,&local_f8,0x1e,1,2,local_90,"output",local_68,"expected");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(pangram_to_hex_test) {
	const std::string input    = "The quick brown fox jumps over the lazy dog";
	const std::string expected = "54686520717569636b2062726f776e20666f78206a7"
				     "56d7073206f76657220746865206c617a7920646f67";

	std::string output = cryptox::to_hex(input.begin(), input.end());
	BOOST_CHECK_EQUAL(output, expected);
}